

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O1

qsizetype __thiscall
QCborStreamReaderPrivate::readStringChunk_unicode
          (QCborStreamReaderPrivate *this,ReadStringChunk params,qsizetype utf8len)

{
  long lVar1;
  char16_t *pcVar2;
  char16_t *pcVar3;
  char16_t *pcVar4;
  QUtf8 *this_00;
  State *__nbytes;
  __off_t extraout_RDX;
  __off_t __length;
  __off_t extraout_RDX_00;
  __off_t extraout_RDX_02;
  anon_union_8_3_4d1d901a_for_ReadStringChunk_0 this_01;
  long size;
  State *in_R8;
  size_t allocSize;
  char16_t *allocSize_00;
  qsizetype qVar5;
  char16_t *buffer;
  char *__file;
  long in_FS_OFFSET;
  bool bVar6;
  QByteArrayView in;
  QByteArrayView in_00;
  QVarLengthArray<char,_256LL> chunk;
  State local_1b0;
  char16_t *local_180;
  char16_t *local_178;
  undefined1 *local_170;
  undefined1 local_168 [256];
  State local_68;
  long local_38;
  __off_t extraout_RDX_01;
  __off_t extraout_RDX_03;
  
  this_01 = params.field_0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = ((DataPointer *)&(this_01.array)->d)->size;
  size = lVar1 + utf8len;
  __nbytes = (State *)CONCAT71((int7)((ulong)utf8len >> 8),-1 < size);
  if (utf8len < 0x3ffffffffffffff7 && -1 < size) {
    QString::resize(this_01.string,size);
    pcVar2 = ((DataPointer *)&(this_01.array)->d)->ptr;
    this_00 = (QUtf8 *)(pcVar2 + lVar1);
    local_68.flags.super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
    super_QFlagsStorage<QStringConverterBase::Flag>.i =
         (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)
         (QFlagsStorage<QStringConverterBase::Flag>)0x1;
    local_68.internalState = 0;
    local_68.remainingChars._0_4_ = 0;
    local_68.remainingChars._4_4_ = 0;
    local_68.invalidChars._0_4_ = 0;
    local_68.invalidChars._4_4_ = 0;
    local_68.field_4.state_data[0] = 0;
    local_68.field_4.state_data[1] = 0;
    local_68.field_4.state_data[2] = 0;
    local_68.field_4.state_data[3] = 0;
    local_68.clearFn = (ClearDataFn)0x0;
    if (this->device == (QIODevice *)0x0) {
      in_00.m_size = (this->buffer).d.ptr + this->bufferStart;
      in_00.m_data = (storage_type *)&local_68;
      this_00 = (QUtf8 *)QUtf8::convertToUnicode(this_00,(char16_t *)utf8len,in_00,in_R8);
      __length = extraout_RDX_03;
LAB_004ad29d:
      if (CONCAT44(local_68.remainingChars._4_4_,(undefined4)local_68.remainingChars) == 0 &&
          CONCAT44(local_68.invalidChars._4_4_,(undefined4)local_68.invalidChars) == 0) {
        __file = (char *)((long)this_00 - (long)pcVar2 >> 1);
        QString::truncate(this_01.string,__file,__length);
        qVar5 = (long)__file - lVar1;
      }
      else {
        this->corrupt = true;
        (this->lastError).c = InvalidUtf8String;
        qVar5 = -1;
      }
    }
    else {
      allocSize_00 = (char16_t *)0x4000;
      if (utf8len < 0x4000) {
        allocSize_00 = (char16_t *)utf8len;
      }
      memset(&local_180,0xaa,0x118);
      local_180 = (char16_t *)0x100;
      local_178 = (char16_t *)0x0;
      local_170 = local_168;
      if (0x100 < utf8len) {
        local_180 = allocSize_00;
        pcVar3 = (char16_t *)QtPrivate::expectedAllocSize((size_t)allocSize_00,0x10);
        if (pcVar3 == (char16_t *)0x0) {
          pcVar3 = allocSize_00;
        }
        local_170 = (undefined1 *)malloc((size_t)pcVar3);
        local_180 = pcVar3;
        if (local_170 == (undefined1 *)0x0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            qBadAlloc();
          }
          goto LAB_004ad3ba;
        }
      }
      local_1b0.flags.super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
      super_QFlagsStorage<QStringConverterBase::Flag>.i =
           (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)
           (QFlagsStorage<QStringConverterBase::Flag>)0x8;
      local_1b0.internalState = 0;
      local_1b0.remainingChars._0_4_ = 0;
      local_1b0.remainingChars._4_4_ = 0;
      local_1b0.invalidChars._0_4_ = 0;
      local_1b0.invalidChars._4_4_ = 0;
      local_1b0.field_4.state_data[0] = 0;
      local_1b0.field_4.state_data[1] = 0;
      local_1b0.field_4.state_data[2] = 0;
      local_1b0.field_4.state_data[3] = 0;
      local_1b0.clearFn = (ClearDataFn)0x0;
      local_178 = allocSize_00;
      QStringConverterBase::State::clear(&local_68);
      local_68.flags.super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
      super_QFlagsStorage<QStringConverterBase::Flag>.i =
           local_1b0.flags.super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
           super_QFlagsStorage<QStringConverterBase::Flag>.i;
      local_68.remainingChars._0_4_ = (undefined4)local_1b0.remainingChars;
      local_68.remainingChars._4_4_ = local_1b0.remainingChars._4_4_;
      local_68.invalidChars._0_4_ = (undefined4)local_1b0.invalidChars;
      local_68.invalidChars._4_4_ = local_1b0.invalidChars._4_4_;
      local_68.field_4.state_data[0] = local_1b0.field_4.state_data[0];
      local_68.field_4.state_data[1] = local_1b0.field_4.state_data[1];
      local_68.field_4.state_data[2] = local_1b0.field_4.state_data[2];
      local_68.field_4.state_data[3] = local_1b0.field_4.state_data[3];
      local_68.clearFn = local_1b0.clearFn;
      local_1b0.clearFn = (ClearDataFn)0x0;
      QStringConverterBase::State::clear(&local_1b0);
      __length = extraout_RDX;
      for (; bVar6 = CONCAT44(local_68.invalidChars._4_4_,(undefined4)local_68.invalidChars) != 0,
          !bVar6 && utf8len >= 1; utf8len = utf8len - (long)pcVar3) {
        pcVar3 = (char16_t *)utf8len;
        if ((long)allocSize_00 < utf8len) {
          pcVar3 = allocSize_00;
        }
        pcVar4 = (char16_t *)QIODevice::read(this->device,(int)local_170,pcVar3,(size_t)__nbytes);
        if (pcVar4 != pcVar3) {
          this->corrupt = true;
          (this->lastError).c = InputOutputError;
          __length = extraout_RDX_00;
          break;
        }
        __nbytes = &local_68;
        in.m_data = (storage_type *)__nbytes;
        in.m_size = (qsizetype)local_170;
        this_00 = (QUtf8 *)QUtf8::convertToUnicode(this_00,pcVar3,in,in_R8);
        __length = extraout_RDX_01;
      }
      if (local_170 != local_168) {
        QtPrivate::sizedFree(local_170,(size_t)local_180);
        __length = extraout_RDX_02;
      }
      qVar5 = -1;
      if (bVar6 || utf8len < 1) goto LAB_004ad29d;
    }
    QStringConverterBase::State::clear(&local_68);
  }
  else {
    this->corrupt = true;
    (this->lastError).c = DataTooLarge;
    qVar5 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return qVar5;
  }
LAB_004ad3ba:
  __stack_chk_fail();
}

Assistant:

inline qsizetype
QCborStreamReaderPrivate::readStringChunk_unicode(ReadStringChunk params, qsizetype utf8len)
{
    Q_ASSERT(params.isString());

    // See QUtf8::convertToUnicode() a detailed explanation of why this
    // conversion uses the same number of words or less.
    qsizetype currentSize = params.string->size();
    size_t newSize = size_t(utf8len) + size_t(currentSize); // can't overflow
    if (utf8len > QString::maxSize() || qsizetype(newSize) < 0) {
        handleError(CborErrorDataTooLarge);
        return -1;
    }
    QT_TRY {
        params.string->resize(qsizetype(newSize));
    }